

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D<counting_list<unsigned_char*>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,counting_list<unsigned_char_*> *buckets)

{
  ushort uVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  uint j;
  long lVar5;
  size_t *psVar6;
  uchar **ppuVar7;
  long lVar8;
  ulong uVar9;
  counting_list<unsigned_char_*> *pcVar10;
  byte bVar11;
  byte bVar12;
  uint j_1;
  ulong n_00;
  uint i_1;
  uchar **ppuVar13;
  array<unsigned_short,_256UL> bucketsize;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < n) {
      ppuVar7 = strings;
      do {
        puVar2 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        for (ppuVar13 = ppuVar7; strings < ppuVar13; ppuVar13 = ppuVar13 + -1) {
          puVar3 = ppuVar13[-1];
          bVar11 = puVar3[depth];
          bVar12 = puVar2[depth];
          if ((bVar11 != 0) && (lVar5 = depth + 1, bVar11 == bVar12)) {
            do {
              bVar11 = puVar3[lVar5];
              bVar12 = puVar2[lVar5];
              if (bVar11 == 0) break;
              lVar5 = lVar5 + 1;
            } while (bVar11 == bVar12);
          }
          if (bVar11 <= bVar12) break;
          *ppuVar13 = puVar3;
        }
        iVar4 = (int)n;
        *ppuVar13 = puVar2;
        n = (size_t)(iVar4 - 1);
      } while (2 < iVar4);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      ppuVar7 = strings;
      do {
        lVar5 = 0;
        do {
          *(uchar *)((long)local_238 + lVar5) = ppuVar7[lVar5][depth];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        lVar5 = 0;
        ppuVar13 = ppuVar7;
        do {
          counting_list<unsigned_char_*>::push_back
                    (buckets + *(byte *)((long)local_238 + lVar5),ppuVar13);
          lVar5 = lVar5 + 1;
          ppuVar13 = ppuVar13 + 1;
        } while (lVar5 != 0x20);
        uVar9 = uVar9 + 0x20;
        ppuVar7 = ppuVar7 + 0x20;
      } while (uVar9 < (n & 0xffffffffffffffe0));
    }
    lVar5 = n - uVar9;
    if (uVar9 <= n && lVar5 != 0) {
      ppuVar7 = strings + uVar9;
      do {
        counting_list<unsigned_char_*>::push_back(buckets + (*ppuVar7)[depth],ppuVar7);
        ppuVar7 = ppuVar7 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    psVar6 = &buckets->_size;
    lVar5 = 0;
    do {
      local_238[lVar5] = (ushort)*psVar6;
      lVar5 = lVar5 + 1;
      psVar6 = psVar6 + 4;
    } while (lVar5 != 0x100);
    lVar5 = 0;
    lVar8 = 0;
    do {
      uVar1 = local_238[lVar5];
      if ((ulong)uVar1 != 0) {
        pcVar10 = (counting_list<unsigned_char_*> *)
                  buckets[lVar5].super_list<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                  super__List_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                  _M_node.super__List_node_base._M_next;
        if (pcVar10 != buckets + lVar5) {
          ppuVar7 = strings + lVar8;
          do {
            *ppuVar7 = (uchar *)(pcVar10->
                                super_list<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                                super__List_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                                _M_impl._M_node._M_size;
            ppuVar7 = ppuVar7 + 1;
            pcVar10 = (counting_list<unsigned_char_*> *)
                      (pcVar10->super_list<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                      super__List_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                      _M_node.super__List_node_base._M_next;
          } while (pcVar10 != buckets + lVar5);
        }
        lVar8 = lVar8 + (ulong)uVar1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
    lVar5 = 0;
    do {
      counting_list<unsigned_char_*>::clear
                ((counting_list<unsigned_char_*> *)
                 ((long)&(buckets->super_list<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         super__List_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl
                         ._M_node.super__List_node_base._M_next + lVar5));
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0x2000);
    uVar9 = (ulong)local_238[0];
    lVar5 = 1;
    do {
      n_00 = (ulong)local_238[lVar5];
      if (n_00 != 0) {
        msd_D<counting_list<unsigned_char*>,unsigned_short>(strings + uVar9,n_00,depth + 1,buckets);
        uVar9 = uVar9 + n_00;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}